

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<long_double,std::allocator<long_double>>,void>
               (vector<long_double,_std::allocator<long_double>_> *container,ostream *os)

{
  longdouble *plVar1;
  longdouble *plVar2;
  bool bVar3;
  longdouble *plVar4;
  long lVar5;
  char local_35 [5];
  
  local_35[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 2,1);
  plVar1 = (container->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (container->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar1 != plVar2) {
    lVar5 = 0;
    do {
      plVar4 = plVar1 + 1;
      if (lVar5 == 0) {
LAB_001d3f10:
        local_35[1] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 1,1);
        std::ostream::_M_insert<long_double>(*plVar1);
        lVar5 = lVar5 + 1;
        bVar3 = false;
      }
      else {
        local_35[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_35,1);
        if (lVar5 != 0x20) goto LAB_001d3f10;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar3 = true;
      }
    } while ((!bVar3) && (plVar1 = plVar4, plVar4 != plVar2));
    if (lVar5 != 0) {
      local_35[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 3,1);
    }
  }
  local_35[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }